

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

ResourceTable * __thiscall
icu_63::ResourceDataValue::getTable
          (ResourceTable *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  ushort *puVar3;
  uint *puVar4;
  uint uVar5;
  uint local_40;
  int32_t length;
  uint32_t offset;
  Resource *items32;
  uint16_t *items16;
  int32_t *keys32;
  uint16_t *keys16;
  UErrorCode *errorCode_local;
  ResourceDataValue *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    keys32 = (int32_t *)0x0;
    items16 = (uint16_t *)0x0;
    items32 = (Resource *)0x0;
    _length = (uint32_t *)0x0;
    uVar5 = this->res & 0xfffffff;
    local_40 = 0;
    uVar2 = this->res >> 0x1c;
    if (uVar2 == 2) {
      if (uVar5 != 0) {
        puVar3 = (ushort *)(this->pResData->pRoot + uVar5);
        keys32 = (int32_t *)(puVar3 + 1);
        local_40 = (uint)*puVar3;
        _length = (uint32_t *)
                  ((long)keys32 +
                  ((long)(int)local_40 + (long)(int)((local_40 ^ 0xffffffff) & 1)) * 2);
      }
    }
    else if (uVar2 == 4) {
      if (uVar5 != 0) {
        puVar4 = (uint *)(this->pResData->pRoot + uVar5);
        items16 = (uint16_t *)(puVar4 + 1);
        local_40 = *puVar4;
        _length = (uint32_t *)((long)items16 + (long)(int)local_40 * 4);
      }
    }
    else {
      if (uVar2 != 5) {
        *errorCode = U_RESOURCE_TYPE_MISMATCH;
        ResourceTable::ResourceTable(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      puVar3 = this->pResData->p16BitUnits + uVar5;
      keys32 = (int32_t *)(puVar3 + 1);
      local_40 = (uint)*puVar3;
      items32 = (Resource *)((long)keys32 + (long)(int)local_40 * 2);
    }
    ResourceTable::ResourceTable
              (__return_storage_ptr__,(uint16_t *)keys32,(int32_t *)items16,(uint16_t *)items32,
               _length,local_40);
  }
  else {
    ResourceTable::ResourceTable(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceTable ResourceDataValue::getTable(UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return ResourceTable();
    }
    const uint16_t *keys16 = NULL;
    const int32_t *keys32 = NULL;
    const uint16_t *items16 = NULL;
    const Resource *items32 = NULL;
    uint32_t offset = RES_GET_OFFSET(res);
    int32_t length = 0;
    switch(RES_GET_TYPE(res)) {
    case URES_TABLE:
        if (offset != 0) {  // empty if offset==0
            keys16 = (const uint16_t *)(pResData->pRoot+offset);
            length = *keys16++;
            items32 = (const Resource *)(keys16+length+(~length&1));
        }
        break;
    case URES_TABLE16:
        keys16 = pResData->p16BitUnits+offset;
        length = *keys16++;
        items16 = keys16 + length;
        break;
    case URES_TABLE32:
        if (offset != 0) {  // empty if offset==0
            keys32 = pResData->pRoot+offset;
            length = *keys32++;
            items32 = (const Resource *)keys32 + length;
        }
        break;
    default:
        errorCode = U_RESOURCE_TYPE_MISMATCH;
        return ResourceTable();
    }
    return ResourceTable(keys16, keys32, items16, items32, length);
}